

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void hputs(char *hstring,char *keyword,char *cval)

{
  size_t sVar1;
  char *in_RDX;
  int lcval;
  char value [70];
  char squot;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  char *in_stack_000000f0;
  int local_6c;
  char local_68 [79];
  char local_19;
  char *local_18;
  
  local_19 = '\'';
  local_18 = in_RDX;
  sVar1 = strlen(in_RDX);
  local_6c = (int)sVar1;
  if (0x43 < local_6c) {
    local_6c = 0x43;
  }
  local_68[0] = local_19;
  strncpy(local_68 + 1,local_18,(long)local_6c);
  local_68[local_6c + 1] = local_19;
  local_68[local_6c + 2] = '\0';
  hputc(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  return;
}

Assistant:

static void
hputs (hstring,keyword,cval)

char *hstring;	/* FITS header */
char *keyword;	/* Keyword name */
char *cval;	/* character string containing the value for variable
		   keyword.  trailing and leading blanks are removed.  */
{
    char squot = 39;
    char value[70];
    int lcval;

    /*  find length of variable string */

    lcval = strlen (cval);
    if (lcval > 67)
	lcval = 67;

    /* Put quotes around string */
    value[0] = squot;
    strncpy (&value[1],cval,lcval);
    value[lcval+1] = squot;
    value[lcval+2] = 0;

    /* Put value into header string */
    hputc (hstring,keyword,value);

    /* Return to calling program */
    return;
}